

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     ::serialize_elems<binlog::detail::VectorOutputStream>
               (undefined8 *param_1,uint param_2,VectorOutputStream *param_3)

{
  if (param_2 != 0) {
    binlog::detail::VectorOutputStream::write
              (param_3,(int)*param_1,(void *)(ulong)param_2,(size_t)(ulong)param_2);
    return;
  }
  return;
}

Assistant:

static void serialize_elems(
    std::true_type /* batch copy */,
    const Sequence& s, std::uint32_t size, OutputStream& ostream
  )
  {
    // Avoid passing nullptr `data` to write, that ends up calling memcpy
    // (e.g: if OutputStream is QueueWriter) as it is undefined behavior
    // C11 7.24.1 String function conventions p2
    if (size)
    {
      const char* data = reinterpret_cast<const char*>(sequence_data(s));
      const size_t serialized_size = sizeof(sequence_data_t<const Sequence>) * size;
      ostream.write(data, std::streamsize(serialized_size));
    }
  }